

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::
step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)6>_>
          (xpath_ast_node *this,xpath_node_set_raw *ns,xpath_node *xn,xpath_allocator *alloc,
          byte once)

{
  xml_node_struct *pxVar1;
  bool bVar2;
  xml_node xVar3;
  xml_node_struct *n;
  
  xVar3 = xpath_node::node(xn);
  if (xVar3._root == (xml_node_struct *)0x0) {
    if (((xn->_attribute)._attr != (xml_attribute_struct *)0x0) &&
       (xVar3 = xpath_node::parent(xn), xVar3._root != (xml_node_struct *)0x0)) {
      xVar3 = xpath_node::parent(xn);
      while (xVar3._root != (xml_node_struct *)0x0) {
        pxVar1 = (xVar3._root)->first_child;
        if ((xVar3._root)->first_child == (xml_node_struct *)0x0) {
          while (pxVar1 = (xVar3._root)->next_sibling,
                (xVar3._root)->next_sibling == (xml_node_struct *)0x0) {
            xVar3._root = (xVar3._root)->parent;
            if (xVar3._root == (xml_node_struct *)0x0) {
              return;
            }
          }
        }
        xVar3._root = pxVar1;
        bVar2 = step_push(this,ns,xVar3._root,alloc);
        if ((bVar2 & once) == 1) {
          return;
        }
      }
    }
  }
  else {
    xVar3 = xpath_node::node(xn);
    do {
      pxVar1 = (xVar3._root)->next_sibling;
      if ((xVar3._root)->next_sibling != (xml_node_struct *)0x0) {
        do {
          do {
            n = pxVar1;
            bVar2 = step_push(this,ns,n,alloc);
            if ((bVar2 & once) != 0) {
              return;
            }
            pxVar1 = n->first_child;
          } while (n->first_child != (xml_node_struct *)0x0);
          while (pxVar1 = n->next_sibling, n->next_sibling == (xml_node_struct *)0x0) {
            n = n->parent;
            if (n == (xml_node_struct *)0x0) {
              return;
            }
          }
        } while( true );
      }
      xVar3._root = (xVar3._root)->parent;
    } while (xVar3._root != (xml_node_struct *)0x0);
  }
  return;
}

Assistant:

void step_fill(xpath_node_set_raw& ns, const xpath_node& xn, xpath_allocator* alloc, bool once, T v)
		{
			const axis_t axis = T::axis;
			const bool axis_has_attributes = (axis == axis_ancestor || axis == axis_ancestor_or_self || axis == axis_descendant_or_self || axis == axis_following || axis == axis_parent || axis == axis_preceding || axis == axis_self);

			if (xn.node())
				step_fill(ns, xn.node().internal_object(), alloc, once, v);
			else if (axis_has_attributes && xn.attribute() && xn.parent())
				step_fill(ns, xn.attribute().internal_object(), xn.parent().internal_object(), alloc, once, v);
		}